

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int bitset_container_number_of_runs(bitset_container_t *bc)

{
  uint64_t uVar1;
  int iVar2;
  uint64_t word;
  uint64_t word_1;
  uint64_t uStack_20;
  int i;
  uint64_t next_word;
  int num_runs;
  bitset_container_t *bc_local;
  
  next_word._4_4_ = 0;
  uStack_20 = *bc->words;
  for (word_1._4_4_ = 0; word_1._4_4_ < 0x3ff; word_1._4_4_ = word_1._4_4_ + 1) {
    uVar1 = bc->words[word_1._4_4_ + 1];
    iVar2 = hamming((uStack_20 ^ 0xffffffffffffffff) & uStack_20 << 1);
    next_word._4_4_ =
         next_word._4_4_ + iVar2 + ((uint)(uStack_20 >> 0x3f) & ((uint)uVar1 ^ 0xffffffff));
    uStack_20 = uVar1;
  }
  iVar2 = hamming((uStack_20 ^ 0xffffffffffffffff) & uStack_20 << 1);
  next_word._4_4_ = iVar2 + next_word._4_4_;
  if ((uStack_20 & 0x8000000000000000) != 0) {
    next_word._4_4_ = next_word._4_4_ + 1;
  }
  return next_word._4_4_;
}

Assistant:

int bitset_container_number_of_runs(bitset_container_t *bc) {
  int num_runs = 0;
  uint64_t next_word = bc->words[0];

  for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS-1; ++i) {
    uint64_t word = next_word;
    next_word = bc->words[i+1];
    num_runs += hamming((~word) & (word << 1)) + ( (word >> 63) & ~next_word);
  }

  uint64_t word = next_word;
  num_runs += hamming((~word) & (word << 1));
  if((word & 0x8000000000000000ULL) != 0)
    num_runs++;
  return num_runs;
}